

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLimit::SetMin(ChLinkLimit *this,double val)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  this->m_min = val;
  dVar3 = this->m_max;
  if (this->m_max < val) {
    this->m_max = val;
    dVar3 = val;
  }
  dVar2 = dVar3 - val;
  dVar1 = this->m_minCushion + val;
  dVar4 = this->m_minCushion;
  if (dVar3 < dVar1) {
    dVar1 = dVar2 + val;
    this->m_minCushion = dVar2;
    dVar4 = dVar2;
  }
  if (dVar3 - this->m_maxCushion < dVar1) {
    this->m_maxCushion = dVar2 - dVar4;
  }
  (this->constr_lower).super_ChConstraintTwo.super_ChConstraint.active = true;
  return;
}

Assistant:

void ChLinkLimit::SetMin(double val) {
    m_min = val;
    if (m_min > m_max)
        m_max = m_min;
    if (m_min + m_minCushion > m_max)
        m_minCushion = m_max - m_min;
    if (m_min + m_minCushion > m_max - m_maxCushion)
        m_maxCushion = m_max - m_min - m_minCushion;
    constr_lower.SetActive(true);
}